

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

xmlCatalogPtr xmlNewCatalog(int sgml)

{
  xmlCatalogPtr pxVar1;
  xmlHashTablePtr pxVar2;
  
  if (sgml != 0) {
    pxVar1 = xmlCreateNewCatalog(XML_SGML_CATALOG_TYPE,xmlCatalogDefaultPrefer);
    if (pxVar1 == (xmlCatalogPtr)0x0) {
      pxVar1 = (xmlCatalogPtr)0x0;
    }
    else if (pxVar1->sgml == (xmlHashTablePtr)0x0) {
      pxVar2 = xmlHashCreate(10);
      pxVar1->sgml = pxVar2;
    }
    return pxVar1;
  }
  pxVar1 = xmlCreateNewCatalog(XML_XML_CATALOG_TYPE,xmlCatalogDefaultPrefer);
  return pxVar1;
}

Assistant:

xmlCatalogPtr
xmlNewCatalog(int sgml) {
    xmlCatalogPtr catal = NULL;

    if (sgml) {
	catal = xmlCreateNewCatalog(XML_SGML_CATALOG_TYPE,
		                    xmlCatalogDefaultPrefer);
        if ((catal != NULL) && (catal->sgml == NULL))
	    catal->sgml = xmlHashCreate(10);
    } else
	catal = xmlCreateNewCatalog(XML_XML_CATALOG_TYPE,
		                    xmlCatalogDefaultPrefer);
    return(catal);
}